

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O1

MemberSyntax * __thiscall slang::parsing::Parser::parseModportPort(Parser *this)

{
  SyntaxFactory *this_00;
  bool bVar1;
  TokenKind TVar2;
  int iVar3;
  ModportNamedPortSyntax *pMVar4;
  ExpressionSyntax *expr;
  ModportExplicitPortSyntax *pMVar5;
  undefined4 extraout_var;
  ModportSimplePortListSyntax *pMVar6;
  MemberSyntax *pMVar7;
  ModportClockingPortSyntax *pMVar8;
  SourceLocation SVar9;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *src;
  AttrList attributes;
  Token TVar10;
  Token TVar11;
  Token dot;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  pointer local_1d0;
  __extent_storage<18446744073709551615UL> local_1c8;
  Token local_1b8;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_1a8;
  ulong local_198;
  undefined8 uStack_190;
  size_t local_188;
  pointer local_180;
  size_t local_178;
  Info *local_170;
  undefined8 local_168;
  Token local_160;
  Token local_150;
  undefined1 local_140 [24];
  undefined1 auStack_128 [24];
  __extent_storage<18446744073709551615UL> local_110;
  SeparatedSyntaxList<slang::syntax::ModportPortSyntax> local_68;
  
  attributes = parseAttributes(this);
  Token::Token(&local_1b8);
  TVar10 = ParserBase::peek(&this->super_ParserBase);
  TVar2 = TVar10.kind;
  local_1d0 = attributes._M_ptr;
  local_1c8 = attributes._M_extent._M_extent_value;
  if (TVar2 < InOutKeyword) {
    if (TVar2 == ClockingKeyword) {
      TVar10 = ParserBase::consume(&this->super_ParserBase);
      local_140._8_4_ = 1;
      local_140._16_8_ = (SyntaxNode *)0x0;
      auStack_128._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
      auStack_128._8_8_ = local_1c8._M_extent_value;
      auStack_128._16_8_ = local_1d0;
      local_110._M_extent_value = local_1c8._M_extent_value;
      local_140._0_8_ = &PTR_getChild_006a4d30;
      TVar11 = ParserBase::expect(&this->super_ParserBase,Identifier);
      pMVar8 = slang::syntax::SyntaxFactory::modportClockingPort
                         (&this->factory,
                          (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)local_140,TVar10,
                          TVar11);
      return &pMVar8->super_MemberSyntax;
    }
    if ((TVar2 == ExportKeyword) || (TVar2 == ImportKeyword)) {
      pMVar7 = parseModportSubroutinePortList(this,attributes);
      return pMVar7;
    }
  }
  else if (((TVar2 - 0xc1 < 2) || (TVar2 == OutputKeyword)) || (TVar2 == RefKeyword)) {
    local_1b8 = ParserBase::consume(&this->super_ParserBase);
    goto LAB_0043bfb0;
  }
  local_140._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
  SVar9 = Token::location((Token *)local_140);
  ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x7e0005,SVar9);
  local_140._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
  SVar9 = Token::location((Token *)local_140);
  local_1b8 = ParserBase::missingToken(&this->super_ParserBase,InputKeyword,SVar9);
LAB_0043bfb0:
  local_140._8_8_ = 0;
  local_140._0_8_ = auStack_128;
  local_140._16_8_ = (SyntaxNode *)0x8;
  this_00 = &this->factory;
  do {
    bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
    if (bVar1) {
      TVar10 = ParserBase::consume(&this->super_ParserBase);
      local_170 = TVar10.info;
      local_168 = TVar10._0_8_;
      TVar10 = ParserBase::expect(&this->super_ParserBase,Identifier);
      TVar11 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
      bVar1 = ParserBase::peek(&this->super_ParserBase,CloseParenthesis);
      if (bVar1) {
        expr = (ExpressionSyntax *)0x0;
      }
      else {
        expr = parseExpression(this);
      }
      local_150 = TVar11;
      local_160 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      dot.info = local_170;
      dot.kind = (undefined2)local_168;
      dot._2_1_ = local_168._2_1_;
      dot.numFlags.raw = local_168._3_1_;
      dot.rawLen = local_168._4_4_;
      pMVar5 = slang::syntax::SyntaxFactory::modportExplicitPort
                         (this_00,dot,TVar10,local_150,expr,local_160);
      local_1a8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar5;
      local_198 = CONCAT71(local_198._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_140,
                 (TokenOrSyntax *)&local_1a8._M_first);
    }
    else {
      TVar10 = ParserBase::expect(&this->super_ParserBase,Identifier);
      pMVar4 = slang::syntax::SyntaxFactory::modportNamedPort(this_00,TVar10);
      local_1a8._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pMVar4;
      local_198 = CONCAT71(local_198._1_7_,1);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_140,
                 (TokenOrSyntax *)&local_1a8._M_first);
      src = extraout_RDX;
      if ((TVar10._0_4_ >> 0x10 & 1) != 0) {
LAB_0043c184:
        TVar10 = local_1b8;
        local_1a8._8_4_ = 1;
        local_198 = 0;
        uStack_190 = 0;
        local_188 = local_1c8._M_extent_value;
        local_180 = local_1d0;
        local_178 = local_1c8._M_extent_value;
        local_1a8._M_rest =
             (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_006a4d30;
        iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_140,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
        local_68.elements._M_ptr = (pointer)CONCAT44(extraout_var,iVar3);
        local_68.super_SyntaxListBase.super_SyntaxNode.kind = SeparatedList;
        local_68.super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)0x0;
        local_68.super_SyntaxListBase.super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
        local_68.super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_006a5cc8;
        pMVar6 = slang::syntax::SyntaxFactory::modportSimplePortList
                           (this_00,(SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                                    &local_1a8._M_first,TVar10,&local_68);
        if ((pointer)local_140._0_8_ == (pointer)auStack_128) {
          return &pMVar6->super_MemberSyntax;
        }
        operator_delete((void *)local_140._0_8_);
        return &pMVar6->super_MemberSyntax;
      }
    }
    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
    src = extraout_RDX_00;
    if (!bVar1) goto LAB_0043c184;
    TVar10 = ParserBase::peek(&this->super_ParserBase,1);
    if (TVar10.kind != Dot) {
      TVar10 = ParserBase::peek(&this->super_ParserBase,1);
      src = TVar10.info;
      if (TVar10.kind != Identifier) goto LAB_0043c184;
    }
    local_1a8._M_first._M_storage =
         (_Uninitialized<slang::parsing::Token,_true>)ParserBase::consume(&this->super_ParserBase);
    local_198 = local_198 & 0xffffffffffffff00;
    SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_140,
               (TokenOrSyntax *)&local_1a8._M_first);
  } while( true );
}

Assistant:

MemberSyntax& Parser::parseModportPort() {
    auto attributes = parseAttributes();

    Token direction;
    switch (peek().kind) {
        case TokenKind::ClockingKeyword: {
            auto clocking = consume();
            return factory.modportClockingPort(attributes, clocking, expect(TokenKind::Identifier));
        }
        case TokenKind::ImportKeyword:
        case TokenKind::ExportKeyword:
            return parseModportSubroutinePortList(attributes);
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
        case TokenKind::RefKeyword:
            direction = consume();
            break;
        default:
            addDiag(diag::MissingModportPortDirection, peek().location());
            direction = missingToken(TokenKind::InputKeyword, peek().location());
            break;
    }

    SmallVector<TokenOrSyntax, 8> buffer;
    while (true) {
        if (peek(TokenKind::Dot)) {
            auto dot = consume();
            auto name = expect(TokenKind::Identifier);
            auto openParen = expect(TokenKind::OpenParenthesis);

            ExpressionSyntax* expr = nullptr;
            if (!peek(TokenKind::CloseParenthesis))
                expr = &parseExpression();

            buffer.push_back(&factory.modportExplicitPort(dot, name, openParen, expr,
                                                          expect(TokenKind::CloseParenthesis)));
        }
        else {
            auto name = expect(TokenKind::Identifier);
            buffer.push_back(&factory.modportNamedPort(name));
            if (name.isMissing())
                break;
        }

        if (!peek(TokenKind::Comma) ||
            (peek(1).kind != TokenKind::Dot && peek(1).kind != TokenKind::Identifier)) {
            break;
        }

        buffer.push_back(consume());
    }

    return factory.modportSimplePortList(attributes, direction, buffer.copy(alloc));
}